

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_IndexSpaceI.H
# Opt level: O3

void __thiscall
amrex::EB2::
IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>
::IndexSpaceImp(IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>
                *this,GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>
                      *gshop,Geometry *geom,int required_coarsening_level,int max_coarsening_level,
               int ngrow,bool build_coarse_level_by_coarsening,bool extend_domain_face,
               int num_coarsen_opt)

{
  Vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
  *this_00;
  pointer *ppGVar1;
  pointer *ppBVar2;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  pointer pGVar6;
  pointer pGVar7;
  uint uVar8;
  Real RVar9;
  undefined8 uVar10;
  Real RVar11;
  Real RVar12;
  Real RVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
  *pvVar16;
  vector<amrex::Box,_std::allocator<amrex::Box>_> *pvVar17;
  vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *pvVar18;
  vector<int,_std::allocator<int>_> *pvVar19;
  Geometry *__args_2;
  bool bVar20;
  int iVar21;
  uint uVar22;
  long *plVar23;
  int iVar24;
  ulong uVar25;
  Real *pRVar26;
  size_type *psVar27;
  long lVar28;
  Level *this_01;
  uint uVar29;
  int iVar30;
  uint uVar31;
  bool extend_domain_face_local;
  uint local_1b0;
  int ng;
  int local_1a8;
  int local_1a4;
  string __str;
  Box result;
  long *local_130 [2];
  long local_120 [2];
  GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>
  *local_110;
  gpu_tuple_element<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>_> *local_108;
  Geometry *local_100;
  Geometry cgeom;
  
  iVar30 = num_coarsen_opt;
  extend_domain_face_local = extend_domain_face;
  (this->super_IndexSpace)._vptr_IndexSpace = (_func_int **)&PTR__IndexSpaceImp_00713170;
  RVar9 = (gshop->m_f).
          super_GpuTuple<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>.
          super_gpu_tuple_impl<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
          .super_gpu_tuple_impl<1UL,_amrex::EB2::CylinderIF>.
          super_gpu_tuple_element<1UL,_amrex::EB2::CylinderIF>.m_value.m_height;
  uVar10 = *(undefined8 *)
            &(gshop->m_f).
             super_GpuTuple<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>.
             super_gpu_tuple_impl<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
             .super_gpu_tuple_impl<1UL,_amrex::EB2::CylinderIF>.
             super_gpu_tuple_element<1UL,_amrex::EB2::CylinderIF>.m_value.m_direction;
  RVar11 = (gshop->m_f).
           super_GpuTuple<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>.
           super_gpu_tuple_impl<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
           .super_gpu_tuple_impl<1UL,_amrex::EB2::CylinderIF>.
           super_gpu_tuple_element<1UL,_amrex::EB2::CylinderIF>.m_value.m_center.x;
  RVar12 = *(Real *)((long)&(gshop->m_f).
                            super_GpuTuple<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
                            .
                            super_gpu_tuple_impl<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
                            .super_gpu_tuple_impl<1UL,_amrex::EB2::CylinderIF>.
                            super_gpu_tuple_element<1UL,_amrex::EB2::CylinderIF>.m_value.m_center +
                    8);
  RVar13 = *(Real *)((long)&(gshop->m_f).
                            super_GpuTuple<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
                            .
                            super_gpu_tuple_impl<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
                            .super_gpu_tuple_impl<1UL,_amrex::EB2::CylinderIF>.
                            super_gpu_tuple_element<1UL,_amrex::EB2::CylinderIF>.m_value.m_center +
                    0x10);
  (this->m_gshop).m_f.
  super_GpuTuple<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>.
  super_gpu_tuple_impl<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>.
  super_gpu_tuple_impl<1UL,_amrex::EB2::CylinderIF>.
  super_gpu_tuple_element<1UL,_amrex::EB2::CylinderIF>.m_value.m_radius =
       (gshop->m_f).
       super_GpuTuple<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>.
       super_gpu_tuple_impl<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>.
       super_gpu_tuple_impl<1UL,_amrex::EB2::CylinderIF>.
       super_gpu_tuple_element<1UL,_amrex::EB2::CylinderIF>.m_value.m_radius;
  *(Real *)((long)&(this->m_gshop).m_f.
                   super_GpuTuple<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
                   .
                   super_gpu_tuple_impl<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
                   .super_gpu_tuple_impl<1UL,_amrex::EB2::CylinderIF>.
                   super_gpu_tuple_element<1UL,_amrex::EB2::CylinderIF>.m_value + 8) = RVar9;
  *(undefined8 *)
   ((long)&(this->m_gshop).m_f.
           super_GpuTuple<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>.
           super_gpu_tuple_impl<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
           .super_gpu_tuple_impl<1UL,_amrex::EB2::CylinderIF>.
           super_gpu_tuple_element<1UL,_amrex::EB2::CylinderIF>.m_value + 0x10) = uVar10;
  ((XDim3 *)
  ((long)&(this->m_gshop).m_f.
          super_GpuTuple<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>.
          super_gpu_tuple_impl<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
          .super_gpu_tuple_impl<1UL,_amrex::EB2::CylinderIF>.
          super_gpu_tuple_element<1UL,_amrex::EB2::CylinderIF>.m_value + 0x18))->x = RVar11;
  *(Real *)((long)&(this->m_gshop).m_f.
                   super_GpuTuple<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
                   .
                   super_gpu_tuple_impl<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
                   .super_gpu_tuple_impl<1UL,_amrex::EB2::CylinderIF>.
                   super_gpu_tuple_element<1UL,_amrex::EB2::CylinderIF>.m_value + 0x20) = RVar12;
  *(Real *)((long)&(this->m_gshop).m_f.
                   super_GpuTuple<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
                   .
                   super_gpu_tuple_impl<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
                   .super_gpu_tuple_impl<1UL,_amrex::EB2::CylinderIF>.
                   super_gpu_tuple_element<1UL,_amrex::EB2::CylinderIF>.m_value + 0x28) = RVar13;
  *(Real *)((long)&(this->m_gshop).m_f.
                   super_GpuTuple<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
                   .
                   super_gpu_tuple_impl<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
                   .super_gpu_tuple_impl<1UL,_amrex::EB2::CylinderIF>.
                   super_gpu_tuple_element<1UL,_amrex::EB2::CylinderIF>.m_value + 0x30) =
       (gshop->m_f).
       super_GpuTuple<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>.
       super_gpu_tuple_impl<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>.
       super_gpu_tuple_impl<1UL,_amrex::EB2::CylinderIF>.
       super_gpu_tuple_element<1UL,_amrex::EB2::CylinderIF>.m_value.m_sign;
  local_108 = &(this->m_gshop).m_f.
               super_GpuTuple<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>.
               super_gpu_tuple_impl<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
               .super_gpu_tuple_element<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>_>;
  local_100 = geom;
  std::vector<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_>::vector
            ((vector<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_> *)
             local_108,
             (vector<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_> *)
             &(gshop->m_f).
              super_GpuTuple<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>.
              super_gpu_tuple_impl<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>
              .super_gpu_tuple_element<0UL,_amrex::EB2::LatheIF<amrex::EB2::SplineIF>_>);
  (this->m_gshop).m_resource = gshop->m_resource;
  this->m_build_coarse_level_by_coarsening = build_coarse_level_by_coarsening;
  this->m_extend_domain_face = extend_domain_face;
  this->m_num_coarsen_opt = iVar30;
  this_00 = &this->m_gslevel;
  pvVar16 = &(this->m_gslevel).
             super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
  ;
  (pvVar16->
  super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar16->
  super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->m_gslevel).
    super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
    .
    super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  pvVar18 = &(this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  (pvVar18->super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar18->super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar17 = &(this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>;
  (pvVar17->super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar17->super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (undefined1  [16])0x0;
  pvVar19 = &(this->m_ngrow).super_vector<int,_std::allocator<int>_>;
  (pvVar19->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (pvVar19->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1a4 = required_coarsening_level;
  local_110 = gshop;
  if (0x1e < (uint)required_coarsening_level) {
    Assert_host("required_coarsening_level >= 0 && required_coarsening_level <= 30",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EB2_IndexSpaceI.H"
                ,0xe,(char *)0x0);
  }
  __args_2 = local_100;
  iVar30 = local_1a4;
  if (max_coarsening_level < local_1a4) {
    max_coarsening_level = local_1a4;
  }
  iVar21 = 0x1e;
  if (max_coarsening_level < 0x1e) {
    iVar21 = max_coarsening_level;
  }
  local_1a8 = 0;
  if (0 < ngrow) {
    local_1a8 = ngrow;
  }
  iVar24 = local_1a4;
  if (0 < local_1a4) {
    do {
      local_1a8 = local_1a8 * 2;
      iVar24 = iVar24 + -1;
    } while (iVar24 != 0);
  }
  iVar3._M_current =
       (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
      super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>::
    _M_realloc_insert<amrex::Geometry_const&>
              ((vector<amrex::Geometry,std::allocator<amrex::Geometry>> *)&this->m_geom,iVar3,
               local_100);
  }
  else {
    memcpy(iVar3._M_current,local_100,200);
    ppGVar1 = &(this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppGVar1 = *ppGVar1 + 1;
  }
  iVar4._M_current =
       (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar4._M_current ==
      (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
              ((vector<amrex::Box,std::allocator<amrex::Box>> *)&this->m_domain,iVar4,
               &__args_2->domain);
  }
  else {
    uVar10 = *(undefined8 *)(__args_2->domain).smallend.vect;
    uVar14 = *(undefined8 *)((__args_2->domain).smallend.vect + 2);
    uVar15 = *(undefined8 *)((__args_2->domain).bigend.vect + 2);
    *(undefined8 *)((iVar4._M_current)->bigend).vect = *(undefined8 *)(__args_2->domain).bigend.vect
    ;
    *(undefined8 *)(((iVar4._M_current)->bigend).vect + 2) = uVar15;
    *(undefined8 *)((iVar4._M_current)->smallend).vect = uVar10;
    *(undefined8 *)(((iVar4._M_current)->smallend).vect + 2) = uVar14;
    ppBVar2 = &(this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppBVar2 = *ppBVar2 + 1;
  }
  iVar5._M_current =
       (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->m_ngrow,iVar5,&local_1a8);
  }
  else {
    *iVar5._M_current = local_1a8;
    (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         iVar5._M_current + 1;
  }
  std::
  vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
  ::reserve(&this_00->
             super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
            ,(long)(iVar21 + 1));
  cgeom.super_CoordSys._0_8_ = this;
  std::
  vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>>>
  ::
  emplace_back<amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>*,amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>const&,amrex::Geometry_const&,int&,int&,bool&,int&>
            ((vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>>>
              *)this_00,
             (IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>
              **)&cgeom,local_110,__args_2,&EB2::max_grid_size,&local_1a8,&extend_domain_face_local,
             &num_coarsen_opt);
  local_1b0 = 1;
  if (0 < max_coarsening_level) {
    do {
      cgeom.super_CoordSys.c_sys = SPHERICAL;
      cgeom.super_CoordSys._4_4_ = 2;
      cgeom.super_CoordSys.offset[0] = (Real)CONCAT44(cgeom.super_CoordSys.offset[0]._4_4_,2);
      __str._M_dataplus._M_p = (pointer)0x200000002;
      __str._M_string_length = CONCAT44(__str._M_string_length._4_4_,2);
      bVar20 = Box::coarsenable(&(this->m_geom).
                                 super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                 super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                 ._M_impl.super__Vector_impl_data._M_finish[-1].domain,
                                (IntVect *)&cgeom,(IntVect *)&__str);
      if (!bVar20) {
        if (iVar30 < (int)local_1b0) {
          return;
        }
        uVar8 = -local_1b0;
        if (0 < (int)local_1b0) {
          uVar8 = local_1b0;
        }
        uVar31 = 1;
        if (9 < uVar8) {
          uVar25 = (ulong)uVar8;
          uVar29 = 4;
          do {
            uVar31 = uVar29;
            uVar22 = (uint)uVar25;
            if (uVar22 < 100) {
              uVar31 = uVar31 - 2;
              goto LAB_00230bfb;
            }
            if (uVar22 < 1000) {
              uVar31 = uVar31 - 1;
              goto LAB_00230bfb;
            }
            if (uVar22 < 10000) goto LAB_00230bfb;
            uVar25 = uVar25 / 10000;
            uVar29 = uVar31 + 4;
          } while (99999 < uVar22);
          uVar31 = uVar31 + 1;
        }
LAB_00230bfb:
        uVar29 = local_1b0 >> 0x1f;
        __str._M_dataplus._M_p = (pointer)&__str.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&__str,(char)uVar31 - (char)((int)local_1b0 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (__str._M_dataplus._M_p + uVar29,uVar31,uVar8);
        plVar23 = (long *)std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x6648c5);
        iVar30 = local_1a4;
        cgeom.super_CoordSys._0_8_ = cgeom.super_CoordSys.offset + 1;
        pRVar26 = (Real *)(plVar23 + 2);
        if ((Real *)*plVar23 == pRVar26) {
          cgeom.super_CoordSys.offset[1] = *pRVar26;
          cgeom.super_CoordSys.offset[2] = (Real)plVar23[3];
        }
        else {
          cgeom.super_CoordSys.offset[1] = *pRVar26;
          cgeom.super_CoordSys._0_8_ = (Real *)*plVar23;
        }
        cgeom.super_CoordSys.offset[0] = (Real)plVar23[1];
        *plVar23 = (long)pRVar26;
        plVar23[1] = 0;
        *(undefined1 *)(plVar23 + 2) = 0;
        Abort((string *)&cgeom);
        if ((Real *)cgeom.super_CoordSys._0_8_ != cgeom.super_CoordSys.offset + 1) {
          operator_delete((void *)cgeom.super_CoordSys._0_8_,
                          (long)cgeom.super_CoordSys.offset[1] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != &__str.field_2) {
          operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
        }
      }
      ng = 0;
      if ((int)local_1b0 <= iVar30) {
        ng = (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
             [-1] / 2;
      }
      pGVar6 = (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uVar10 = *(undefined8 *)pGVar6[-1].domain.smallend.vect;
      uVar14 = *(undefined8 *)(pGVar6[-1].domain.smallend.vect + 2);
      uVar15 = *(undefined8 *)(pGVar6[-1].domain.bigend.vect + 2);
      result.bigend.vect[2] = (int)uVar15;
      result.btype.itype = SUB84(uVar15,4);
      result.smallend.vect[2] = (int)uVar14;
      result.smallend.vect[0] = (int)uVar10 >> 1;
      result.smallend.vect[1] = (int)((long)uVar10 >> 0x21);
      result.smallend.vect[2] = result.smallend.vect[2] >> 1;
      __str._M_dataplus._M_p = (pointer)0x200000002;
      __str._M_string_length = CONCAT44(__str._M_string_length._4_4_,2);
      result.btype.itype = SUB84(uVar15,4);
      result.bigend.vect[2] = (int)uVar15;
      result.bigend.vect[2] = result.bigend.vect[2] >> 1;
      result.bigend.vect[0] = (int)((long)uVar14 >> 0x21);
      result.bigend.vect[1] = (int)((long)*(undefined8 *)pGVar6[-1].domain.bigend.vect >> 0x21);
      if (result.btype.itype != 0) {
        cgeom.super_CoordSys.c_sys = cartesian;
        cgeom.super_CoordSys._4_4_ = 0;
        cgeom.super_CoordSys.offset[0] =
             (Real)((ulong)cgeom.super_CoordSys.offset[0] & 0xffffffff00000000);
        lVar28 = 0;
        do {
          if (((result.btype.itype >> ((uint)lVar28 & 0x1f) & 1) != 0) &&
             (result.bigend.vect[lVar28] % *(int *)((long)&__str._M_dataplus._M_p + lVar28 * 4) != 0
             )) {
            *(undefined4 *)((long)cgeom.super_CoordSys.offset + lVar28 * 4 + -8) = 1;
          }
          lVar28 = lVar28 + 1;
        } while (lVar28 != 3);
        result.bigend.vect[0] = cgeom.super_CoordSys.c_sys + result.bigend.vect[0];
        result.bigend.vect[1] = cgeom.super_CoordSys._4_4_ + result.bigend.vect[1];
        result.bigend.vect[2] = result.bigend.vect[2] + cgeom.super_CoordSys.offset[0]._0_4_;
      }
      __str._M_dataplus._M_p = (pointer)0x200000002;
      __str._M_string_length = CONCAT44(__str._M_string_length._4_4_,2);
      memcpy(&cgeom,pGVar6 + -1,200);
      Geometry::coarsen(&cgeom,(IntVect *)&__str);
      __str._M_dataplus._M_p = (pointer)this;
      std::
      vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>>>
      ::
      emplace_back<amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>*,int&,int&,int&,amrex::Geometry&,amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>&>
                ((vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>>>
                  *)this_00,
                 (IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>
                  **)&__str,(int *)&local_1b0,&EB2::max_grid_size,&ng,&cgeom,
                 (this->m_gslevel).
                 super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
                 .
                 super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (long)(int)local_1b0 + -1);
      pGVar7 = (this->m_gslevel).
               super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
               .
               super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pGVar7[-1].super_Level.m_ok == false) {
        this_01 = &pGVar7[-1].super_Level;
        (this->m_gslevel).
        super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
        .
        super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)this_01;
        Level::~Level(this_01);
        if (iVar30 < (int)local_1b0) {
          return;
        }
        if (build_coarse_level_by_coarsening) {
          uVar8 = -local_1b0;
          if (0 < (int)local_1b0) {
            uVar8 = local_1b0;
          }
          uVar31 = 1;
          if (9 < uVar8) {
            uVar25 = (ulong)uVar8;
            uVar29 = 4;
            do {
              uVar31 = uVar29;
              uVar22 = (uint)uVar25;
              if (uVar22 < 100) {
                uVar31 = uVar31 - 2;
                goto LAB_00230f63;
              }
              if (uVar22 < 1000) {
                uVar31 = uVar31 - 1;
                goto LAB_00230f63;
              }
              if (uVar22 < 10000) goto LAB_00230f63;
              uVar25 = uVar25 / 10000;
              uVar29 = uVar31 + 4;
            } while (99999 < uVar22);
            uVar31 = uVar31 + 1;
          }
LAB_00230f63:
          uVar29 = local_1b0 >> 0x1f;
          local_130[0] = local_120;
          std::__cxx11::string::_M_construct
                    ((ulong)local_130,(char)uVar31 - (char)((int)local_1b0 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)uVar29 + (long)local_130[0]),uVar31,uVar8);
          plVar23 = (long *)std::__cxx11::string::replace((ulong)local_130,0,(char *)0x0,0x6648f8);
          iVar30 = local_1a4;
          psVar27 = (size_type *)(plVar23 + 2);
          if ((size_type *)*plVar23 == psVar27) {
            __str.field_2._M_allocated_capacity = *psVar27;
            __str.field_2._8_8_ = plVar23[3];
            __str._M_dataplus._M_p = (pointer)&__str.field_2;
          }
          else {
            __str.field_2._M_allocated_capacity = *psVar27;
            __str._M_dataplus._M_p = (pointer)*plVar23;
          }
          __str._M_string_length = plVar23[1];
          *plVar23 = (long)psVar27;
          plVar23[1] = 0;
          *(undefined1 *)(plVar23 + 2) = 0;
          Abort(&__str);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
          }
          if (local_130[0] != local_120) {
            operator_delete(local_130[0],local_120[0] + 1);
          }
        }
        else {
          local_130[0] = (long *)CONCAT44(local_130[0]._4_4_,num_coarsen_opt - local_1b0);
          __str._M_dataplus._M_p = (pointer)this;
          std::
          vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>>>
          ::
          emplace_back<amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>*,amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>const&,amrex::Geometry&,int&,int&,bool&,int>
                    ((vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>>>>
                      *)this_00,
                     (IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>_>
                      **)&__str,local_110,&cgeom,&EB2::max_grid_size,&ng,&extend_domain_face_local,
                     (int *)local_130);
        }
      }
      iVar3._M_current =
           (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
          super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>::
        _M_realloc_insert<amrex::Geometry_const&>
                  ((vector<amrex::Geometry,std::allocator<amrex::Geometry>> *)&this->m_geom,iVar3,
                   &cgeom);
      }
      else {
        memcpy(iVar3._M_current,&cgeom,200);
        ppGVar1 = &(this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                   super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppGVar1 = *ppGVar1 + 1;
      }
      iVar4._M_current =
           (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
                  ((vector<amrex::Box,std::allocator<amrex::Box>> *)&this->m_domain,iVar4,&result);
      }
      else {
        *(ulong *)((iVar4._M_current)->bigend).vect =
             CONCAT44(result.bigend.vect[1],result.bigend.vect[0]);
        *(undefined8 *)(((iVar4._M_current)->bigend).vect + 2) = result._20_8_;
        *(undefined8 *)((iVar4._M_current)->smallend).vect = result.smallend.vect._0_8_;
        *(ulong *)(((iVar4._M_current)->smallend).vect + 2) =
             CONCAT44(result.bigend.vect[0],result.smallend.vect[2]);
        ppBVar2 = &(this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppBVar2 = *ppBVar2 + 1;
      }
      iVar5._M_current =
           (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->m_ngrow,iVar5,&ng);
      }
      else {
        *iVar5._M_current = ng;
        (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             iVar5._M_current + 1;
      }
      bVar20 = (int)local_1b0 < iVar21;
      local_1b0 = local_1b0 + 1;
    } while (bVar20);
  }
  return;
}

Assistant:

IndexSpaceImp<G>::IndexSpaceImp (const G& gshop, const Geometry& geom,
                                 int required_coarsening_level,
                                 int max_coarsening_level,
                                 int ngrow, bool build_coarse_level_by_coarsening,
                                 bool extend_domain_face, int num_coarsen_opt)
    : m_gshop(gshop),
      m_build_coarse_level_by_coarsening(build_coarse_level_by_coarsening),
      m_extend_domain_face(extend_domain_face),
      m_num_coarsen_opt(num_coarsen_opt)
{
    // build finest level (i.e., level 0) first
    AMREX_ALWAYS_ASSERT(required_coarsening_level >= 0 && required_coarsening_level <= 30);
    max_coarsening_level = std::max(required_coarsening_level,max_coarsening_level);
    max_coarsening_level = std::min(30,max_coarsening_level);

    int ngrow_finest = std::max(ngrow,0);
    for (int i = 1; i <= required_coarsening_level; ++i) {
        ngrow_finest *= 2;
    }

    m_geom.push_back(geom);
    m_domain.push_back(geom.Domain());
    m_ngrow.push_back(ngrow_finest);
    m_gslevel.reserve(max_coarsening_level+1);
    m_gslevel.emplace_back(this, gshop, geom, EB2::max_grid_size, ngrow_finest, extend_domain_face,
                           num_coarsen_opt);

    for (int ilev = 1; ilev <= max_coarsening_level; ++ilev)
    {
        bool coarsenable = m_geom.back().Domain().coarsenable(2,2);
        if (!coarsenable) {
            if (ilev <= required_coarsening_level) {
                amrex::Abort("IndexSpaceImp: domain is not coarsenable at level "+std::to_string(ilev));
            } else {
                break;
            }
        }

        int ng = (ilev > required_coarsening_level) ? 0 : m_ngrow.back()/2;

        Box cdomain = amrex::coarsen(m_geom.back().Domain(),2);
        Geometry cgeom = amrex::coarsen(m_geom.back(),2);
        m_gslevel.emplace_back(this, ilev, EB2::max_grid_size, ng, cgeom, m_gslevel[ilev-1]);
        if (!m_gslevel.back().isOK()) {
            m_gslevel.pop_back();
            if (ilev <= required_coarsening_level) {
                if (build_coarse_level_by_coarsening) {
                    amrex::Abort("Failed to build required coarse EB level "+std::to_string(ilev));
                } else {
                    m_gslevel.emplace_back(this, gshop, cgeom, EB2::max_grid_size, ng, extend_domain_face,
                                           num_coarsen_opt-ilev);
                }
            } else {
                break;
            }
        }
        m_geom.push_back(cgeom);
        m_domain.push_back(cdomain);
        m_ngrow.push_back(ng);
    }
}